

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_fseek(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  io_private *pDev;
  jx9_io_stream *pjVar1;
  int iVar2;
  jx9_int64 jVar3;
  char *pcVar4;
  
  if ((((nArg < 2) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (pDev = (io_private *)((*apArg)->x).iVal, pDev == (io_private *)0x0)) ||
     (pDev->iMagic != 0xfeac14)) {
    jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
  }
  else {
    pjVar1 = pDev->pStream;
    if (pjVar1 == (jx9_io_stream *)0x0) {
      pcVar4 = "null_stream";
    }
    else {
      if (pjVar1->xSeek != (_func_int_void_ptr_jx9_int64_int *)0x0) {
        jVar3 = jx9_value_to_int64(apArg[1]);
        iVar2 = 0;
        if ((nArg != 2) && ((apArg[2]->iFlags & 2) != 0)) {
          iVar2 = jx9_value_to_int(apArg[2]);
        }
        iVar2 = (*pjVar1->xSeek)(pDev->pHandle,jVar3,iVar2);
        if (iVar2 == 0) {
          ResetIOPrivate(pDev);
        }
        iVar2 = -(uint)(iVar2 != 0);
        goto LAB_00134ec1;
      }
      pcVar4 = pjVar1->zName;
    }
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying stream(%s) device",
               (pCtx->pFunc->sName).zString,pcVar4);
  }
  iVar2 = -1;
LAB_00134ec1:
  jx9_result_int(pCtx,iVar2);
  return 0;
}

Assistant:

static int jx9Builtin_fseek(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	jx9_int64 iOfft;
	int whence;  
	int rc;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xSeek == 0){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Extract the offset */
	iOfft = jx9_value_to_int64(apArg[1]);
	whence = 0;/* SEEK_SET */
	if( nArg > 2 && jx9_value_is_int(apArg[2]) ){
		whence = jx9_value_to_int(apArg[2]);
	}
	/* Perform the requested operation */
	rc = pStream->xSeek(pDev->pHandle, iOfft, whence);
	if( rc == JX9_OK ){
		/* Ignore buffered data */
		ResetIOPrivate(pDev);
	}
	/* IO result */
	jx9_result_int(pCtx, rc == JX9_OK ? 0 : - 1);
	return JX9_OK;	
}